

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack20_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  uVar2 = *(ulong *)in;
  auVar9._8_8_ = 0x1000000004;
  auVar9._0_8_ = 0x1000000004;
  auVar3 = vpmovsxbd_avx(ZEXT416(0x4010100));
  auVar11._8_8_ = 0xf0000000ffff0;
  auVar11._0_8_ = 0xf0000000ffff0;
  auVar12._8_4_ = 0xfffff;
  auVar12._0_8_ = 0xfffff000fffff;
  auVar12._12_4_ = 0xfffff;
  uVar1 = in[4];
  *out = (uint)uVar2 & 0xfffff;
  auVar6 = vpinsrd_avx(auVar12,((uint)(uVar2 >> 0x20) & 0xff) << 0xc,0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(in + 2);
  auVar8 = vpsllvd_avx2(auVar5,auVar9);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar2;
  auVar5 = vpermt2d_avx512vl(auVar7,auVar3,auVar5);
  auVar7 = vpmovsxbd_avx(ZEXT416(0x101c0814));
  uVar4 = (uint)(*(ulong *)(in + 2) >> 0x20);
  auVar8 = vpand_avx(auVar8,auVar11);
  auVar8 = vpunpcklqdq_avx(auVar6,auVar8);
  auVar5 = vpsrlvd_avx2(auVar5,auVar7);
  auVar6 = vpor_avx(auVar5,auVar8);
  auVar8 = vpand_avx(auVar5,auVar12);
  auVar8 = vpblendd_avx2(auVar6,auVar8,2);
  *(undefined1 (*) [16])(out + 1) = auVar8;
  out[5] = uVar4 >> 4 & 0xfffff;
  out[6] = uVar4 >> 0x18 | (uVar1 & 0xfff) << 8;
  uVar2 = *(ulong *)(in + 5);
  out[7] = uVar1 >> 0xc;
  uVar1 = in[9];
  out[8] = (uint)uVar2 & 0xfffff;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(in + 7);
  auVar6 = vpermt2d_avx512vl(auVar8,auVar3,auVar10);
  auVar8 = vpsllvd_avx2(auVar10,auVar9);
  auVar8 = vpand_avx(auVar8,auVar11);
  auVar3 = vpsrlvd_avx2(auVar6,auVar7);
  auVar6 = vpinsrd_avx(auVar12,((uint)(uVar2 >> 0x20) & 0xff) << 0xc,0);
  uVar4 = (uint)(*(ulong *)(in + 7) >> 0x20);
  auVar8 = vpunpcklqdq_avx(auVar6,auVar8);
  auVar6 = vpor_avx(auVar3,auVar8);
  auVar8 = vpand_avx(auVar3,auVar12);
  auVar8 = vpblendd_avx2(auVar6,auVar8,2);
  *(undefined1 (*) [16])(out + 9) = auVar8;
  out[0xd] = uVar4 >> 4 & 0xfffff;
  out[0xe] = uVar4 >> 0x18 | (uVar1 & 0xfff) << 8;
  out[0xf] = uVar1 >> 0xc;
  return in + 10;
}

Assistant:

const uint32_t *__fastunpack20_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 8)) << (20 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 20);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 16)) << (20 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 4)) << (20 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 20);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 12)) << (20 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 8)) << (20 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 20);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 16)) << (20 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 4)) << (20 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 20);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 12)) << (20 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  out++;

  return in;
}